

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxCompoundStatement::Emit(FxCompoundStatement *this,VMFunctionBuilder *build)

{
  uint uVar1;
  FxLocalVariableDeclaration **ppFVar2;
  ExpEmit EVar3;
  long lVar4;
  
  EVar3 = FxSequence::Emit(&this->super_FxSequence,build);
  ppFVar2 = (this->LocalVars).Array;
  uVar1 = (this->LocalVars).Count;
  for (lVar4 = 0; (ulong)uVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    FxLocalVariableDeclaration::Release
              (*(FxLocalVariableDeclaration **)((long)ppFVar2 + lVar4),build);
  }
  return EVar3;
}

Assistant:

ExpEmit FxCompoundStatement::Emit(VMFunctionBuilder *build)
{
	auto e = FxSequence::Emit(build);
	// Release all local variables in this block.
	for (auto l : LocalVars)
	{
		l->Release(build);
	}
	return e;
}